

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgStatement.cpp
# Opt level: O0

float rsg::DeclarationStatement::getWeight(GeneratorState *state)

{
  bool bVar1;
  VariableManager *varMgr;
  ProgramParameters *pPVar2;
  GeneratorState *state_local;
  
  varMgr = GeneratorState::getVariableManager(state);
  bVar1 = anon_unknown_0::hasDeclarableVars(varMgr);
  if (bVar1) {
    bVar1 = anon_unknown_0::isCurrentTopStatementBlock(state);
    if (bVar1) {
      pPVar2 = GeneratorState::getProgramParameters(state);
      state_local._4_4_ = (float)(pPVar2->declarationStatementBaseWeight & 1);
    }
    else {
      state_local._4_4_ = 0.0;
    }
  }
  else {
    state_local._4_4_ = 0.0;
  }
  return state_local._4_4_;
}

Assistant:

float DeclarationStatement::getWeight (const GeneratorState& state)
{
	if (!hasDeclarableVars(state.getVariableManager()))
		return 0.0f;

	if (!isCurrentTopStatementBlock(state))
		return 0.0f;

	return state.getProgramParameters().declarationStatementBaseWeight;
}